

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

Maybe<unsigned_long> __thiscall
kj::InsertionOrderIndex::insertImpl(InsertionOrderIndex *this,size_t pos)

{
  ulong in_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  Maybe<unsigned_long> MVar1;
  size_t pos_local;
  InsertionOrderIndex *this_local;
  
  if (*(uint *)pos <= in_RDX) {
    reserve((InsertionOrderIndex *)pos,in_RDX + 1);
  }
  *(undefined4 *)(*(long *)(pos + 8) + 0xc + in_RDX * 8) = *(undefined4 *)(*(long *)(pos + 8) + 4);
  *(undefined4 *)(*(long *)(pos + 8) + 8 + in_RDX * 8) = 0;
  *(int *)(*(long *)(pos + 8) + (ulong)*(uint *)(*(long *)(pos + 8) + 4) * 8) = (int)in_RDX + 1;
  *(int *)(*(long *)(pos + 8) + 4) = (int)in_RDX + 1;
  Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this);
  MVar1.ptr.field_1.value = extraout_RDX.value;
  MVar1.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar1.ptr;
}

Assistant:

kj::Maybe<size_t> InsertionOrderIndex::insertImpl(size_t pos) {
  if (pos >= capacity) {
    reserve(pos + 1);
  }

  links[pos + 1].prev = links[0].prev;
  links[pos + 1].next = 0;
  links[links[0].prev].next = pos + 1;
  links[0].prev = pos + 1;

  return kj::none;
}